

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

blow_effect_conflict * lookup_monster_blow_effect(char *eff_name)

{
  int iVar1;
  blow_effect *local_18;
  blow_effect_conflict *eff;
  char *eff_name_local;
  
  local_18 = blow_effects;
  while ((local_18 != (blow_effect *)0x0 && (iVar1 = strcmp(local_18->name,eff_name), iVar1 != 0)))
  {
    local_18 = local_18->next;
  }
  return (blow_effect_conflict *)local_18;
}

Assistant:

struct blow_effect *lookup_monster_blow_effect(const char *eff_name) {
	struct blow_effect *eff = &blow_effects[0];
	while (eff) {
		if (streq(eff->name, eff_name))
			break;
		eff = eff->next;
	}
	return eff;
}